

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void ArgmaxTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  typed_option<float> *op;
  typed_option<float> *this;
  undefined8 *in_RDX;
  search *in_RDI;
  option_group_definition new_options;
  task_data *D;
  typed_option<float> *in_stack_fffffffffffffa48;
  typed_option<float> *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  allocator *paVar1;
  typed_option<float> *in_stack_fffffffffffffa60;
  option_group_definition *this_00;
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [300];
  uint32_t in_stack_fffffffffffffc1c;
  search *in_stack_fffffffffffffc20;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [359];
  undefined1 local_219 [40];
  allocator local_1f1;
  string local_1f0 [375];
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [56];
  task_data *local_20;
  undefined8 *local_18;
  search *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = (task_data *)operator_new(0xc);
  *(undefined4 *)&local_20->predict_max = 0;
  local_20->false_negative_cost = 0.0;
  local_20->negative_weight = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"argmax options",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffa50,
             (string *)in_stack_fffffffffffffa48);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"cost",&local_1f1);
  VW::config::make_option<float>(in_stack_fffffffffffffa58,(float *)in_stack_fffffffffffffa50);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffffa60,(float)((ulong)in_stack_fffffffffffffa58 >> 0x20));
  this_00 = (option_group_definition *)local_219;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_219 + 1),"False Negative Cost",(allocator *)this_00)
  ;
  op = VW::config::typed_option<float>::help
                 (in_stack_fffffffffffffa50,(string *)in_stack_fffffffffffffa48);
  VW::config::typed_option<float>::typed_option(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48)
  ;
  VW::config::option_group_definition::add<float>(this_00,op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"negative_weight",&local_381);
  VW::config::make_option<float>(in_stack_fffffffffffffa58,(float *)in_stack_fffffffffffffa50);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffffa60,(float)((ulong)in_stack_fffffffffffffa58 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"Relative weight of negative examples",&local_3a9);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffffa50,(string *)in_stack_fffffffffffffa48);
  VW::config::typed_option<float>::typed_option(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48)
  ;
  VW::config::option_group_definition::add<float>(this_00,op);
  paVar1 = &local_511;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"max",paVar1);
  VW::config::make_option<bool>(in_stack_fffffffffffffa58,(bool *)in_stack_fffffffffffffa50);
  paVar1 = &local_539;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"Disable structure: just predict the max",paVar1);
  this = (typed_option<float> *)
         VW::config::typed_option<bool>::help
                   ((typed_option<bool> *)in_stack_fffffffffffffa50,
                    (string *)in_stack_fffffffffffffa48);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)this,(typed_option<bool> *)in_stack_fffffffffffffa48);
  VW::config::option_group_definition::add<bool>(this_00,(typed_option<bool> *)op);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)this);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)this);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string((string *)(local_219 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_219);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  (**(code **)*local_18)(local_18,local_58);
  Search::search::set_task_data<ArgmaxTask::task_data>(local_8,local_20);
  if ((local_20->predict_max & 1U) == 0) {
    Search::search::set_options(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
  }
  else {
    Search::search::set_options(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
  }
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)this);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* D = new task_data();

  option_group_definition new_options("argmax options");
  new_options.add(make_option("cost", D->false_negative_cost).default_value(10.0f).help("False Negative Cost"))
      .add(make_option("negative_weight", D->negative_weight)
               .default_value(1.f)
               .help("Relative weight of negative examples"))
      .add(make_option("max", D->predict_max).help("Disable structure: just predict the max"));
  options.add_and_parse(new_options);

  sch.set_task_data(D);

  if (D->predict_max)
    sch.set_options(Search::EXAMPLES_DONT_CHANGE);  // we don't do any internal example munging
  else
    sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
        Search::EXAMPLES_DONT_CHANGE);                 // we don't do any internal example munging
}